

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger default_delegate_len(HSQUIRRELVM v)

{
  SQInteger x;
  SQObjectPtr local_20;
  HSQUIRRELVM local_10;
  HSQUIRRELVM v_local;
  
  local_10 = v;
  x = sq_getsize(v,1);
  SQObjectPtr::SQObjectPtr(&local_20,x);
  SQVM::Push(v,&local_20);
  SQObjectPtr::~SQObjectPtr(&local_20);
  return 1;
}

Assistant:

static SQInteger default_delegate_len(HSQUIRRELVM v)
{
    v->Push(SQInteger(sq_getsize(v,1)));
    return 1;
}